

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sun.cpp
# Opt level: O3

double __thiscall ON_Sun::CImpl::TimeZone(CImpl *this)

{
  double dVar1;
  ON_XMLVariant local_200;
  ON_XMLVariant local_108;
  
  ::ON_XMLVariant::ON_XMLVariant(&local_108,0.0);
  ON_InternalXMLImpl::GetParameter
            (&local_200,&this->super_ON_InternalXMLImpl,
             L"render-content-manager-document/settings/sun",L"observer-timezone",&local_108);
  dVar1 = ::ON_XMLVariant::operator_cast_to_double(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_200);
  ::ON_XMLVariant::~ON_XMLVariant(&local_108);
  return dVar1;
}

Assistant:

double ON_Sun::CImpl::TimeZone(void) const
{
  return GetParameter(XMLPath_Sun(), ON_RDK_SUN_OBSERVER_TIMEZONE, 0.0);
}